

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpaceTest.cpp
# Opt level: O3

void __thiscall RealPointDiff::test_method(RealPointDiff *this)

{
  bool bVar1;
  VectorXd x;
  RealSpace R7;
  void *local_240;
  undefined8 local_238;
  shared_count sStack_230;
  void *local_228;
  ulong local_220;
  void *local_218;
  undefined8 uStack_210;
  sp_counted_base *local_208;
  RealScalar local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined **local_1b0;
  void *local_1a8;
  undefined8 *local_1a0;
  char **local_198;
  undefined8 uStack_190;
  code *local_88 [11];
  void *local_30;
  void *local_20;
  
  mnf::RealSpace::RealSpace((RealSpace *)local_88,7);
  local_218 = (void *)0x0;
  uStack_210 = 0;
  local_208 = (sp_counted_base *)0x0;
  mnf::Manifold::createPoint();
  mnf::SubPoint::value();
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_228,
             (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              *)&local_240);
  mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)&local_198);
  free(local_1a8);
  local_198 = (char **)0x0;
  uStack_190 = 0;
  local_1b0 = (undefined **)local_228;
  local_1a8 = (void *)local_220;
  if (-1 < (long)local_220 || local_228 == (void *)0x0) {
    mnf::Manifold::diffRetractation((Ref_conflict *)&local_240);
    local_208 = sStack_230.pi_;
    uStack_210 = local_238;
    local_218 = local_240;
    local_240 = (void *)0x0;
    local_238 = 0;
    sStack_230.pi_ = (sp_counted_base *)0x0;
    free(local_198);
    local_1c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
    ;
    local_1b8 = "";
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x8c);
    local_1f8 = 1e-12;
    bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::isIdentity
                      ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_218,
                       &local_1f8);
    local_240 = (void *)CONCAT71(local_240._1_7_,bVar1);
    local_238 = 0;
    sStack_230.pi_ = (sp_counted_base *)0x0;
    local_198 = &local_1e0;
    local_1e0 = "J.isIdentity()";
    local_1d8 = "";
    local_1a8 = (void *)((ulong)local_1a8 & 0xffffffffffffff00);
    local_1b0 = &PTR__lazy_ostream_0012bc88;
    local_1a0 = &boost::unit_test::lazy_ostream::inst;
    local_1f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
    ;
    local_1e8 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_230);
    free(local_228);
    free(local_218);
    local_88[0] = std::terminate;
    free(local_20);
    free(local_30);
    mnf::Manifold::~Manifold((Manifold *)local_88);
    return;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
               );
}

Assistant:

BOOST_AUTO_TEST_CASE(RealPointDiff)
{
  RealSpace R7(7);
  Eigen::MatrixXd J;
  Eigen::VectorXd x = R7.createPoint().value();
  J = R7.diffRetractation(x);
  BOOST_CHECK(J.isIdentity());
}